

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

void __thiscall gl3cts::TransformFeedback::DiscardGeometry::checkFramebuffer(DiscardGeometry *this)

{
  GLuint in_ESI;
  
  checkFramebuffer((DiscardGeometry *)
                   ((long)&(this->super_CaptureGeometryInterleaved)._vptr_CaptureGeometryInterleaved
                   + (long)(this->super_CaptureGeometryInterleaved)._vptr_CaptureGeometryInterleaved
                           [-0xb]),in_ESI);
  return;
}

Assistant:

bool gl3cts::TransformFeedback::DiscardGeometry::checkFramebuffer(glw::GLuint primitive_case UNUSED)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetch framebuffer. */
	std::vector<glw::GLfloat> pixels(s_framebuffer_size * s_framebuffer_size);

	if ((s_framebuffer_size > 0) && (s_framebuffer_size > 0))
	{
		gl.readPixels(0, 0, s_framebuffer_size, s_framebuffer_size, GL_RED, GL_FLOAT, pixels.data());
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");
	}

	/* Check results.
	 Note: assuming that s_buffer_size == 2 -> then all points shall be drawn. */
	for (std::vector<glw::GLfloat>::iterator i = pixels.begin(); i != pixels.end(); ++i)
	{
		if (fabs(*i) > 0.0625f /* precision */)
		{
			return false;
		}
	}

	return true;
}